

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QString * __thiscall QGraphicsItem::toolTip(QString *__return_storage_ptr__,QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  long lVar2;
  QVariant *pQVar3;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  lVar2 = (pQVar1->extras).d.size;
  if (lVar2 != 0) {
    pQVar3 = &((pQVar1->extras).d.ptr)->value;
    do {
      if (*(int *)((long)(pQVar3 + -1) + 0x18) == 0) {
        ::QVariant::QVariant((QVariant *)&local_38,pQVar3);
        goto LAB_005db007;
      }
      pQVar3 = (QVariant *)((long)(pQVar3 + 1) + 8);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  local_38.shared = (PrivateShared *)0x0;
  local_38._8_8_ = 0;
  local_38._16_8_ = 0;
  local_20 = 2;
LAB_005db007:
  ::QVariant::toString();
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QGraphicsItem::toolTip() const
{
    return d_ptr->extra(QGraphicsItemPrivate::ExtraToolTip).toString();
}